

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptxinfo.cpp
# Opt level: O3

void DumpFaceInfo(FaceInfo *f)

{
  Res RVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  long lVar3;
  byte bVar4;
  char *pcVar5;
  byte bVar6;
  undefined8 uStack_38;
  
  RVar1 = f->res;
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  res: ",7);
  bVar4 = RVar1.ulog2;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)(char)bVar4);
  uStack_38._0_2_ = CONCAT11(0x20,(undefined1)uStack_38);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)((long)&uStack_38 + 1),1);
  bVar6 = RVar1.vlog2;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)(char)bVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,1 << (bVar4 & 0x1f));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," x ",3);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,1 << (bVar6 & 0x1f));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  adjface: ",0xb);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,f->adjfaces[0]);
  uStack_38._0_3_ = CONCAT12(0x20,(undefined2)uStack_38);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)((long)&uStack_38 + 2),1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,f->adjfaces[1]);
  uStack_38._0_4_ = CONCAT13(0x20,(undefined3)uStack_38);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)((long)&uStack_38 + 3),1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,f->adjfaces[2]);
  uStack_38._0_5_ = CONCAT14(0x20,(undefined4)uStack_38);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)((long)&uStack_38 + 4),1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,f->adjfaces[3]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  adjedge: ",0xb);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,f->adjedges & 3);
  uStack_38._0_6_ = CONCAT15(0x20,(undefined5)uStack_38);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)((long)&uStack_38 + 5),1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,f->adjedges >> 2 & 3);
  uStack_38._0_7_ = CONCAT16(0x20,(undefined6)uStack_38);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)((long)&uStack_38 + 6),1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,f->adjedges >> 4 & 3);
  uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)((long)&uStack_38 + 7),1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)(f->adjedges >> 6));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  flags:",8);
  bVar4 = f->flags;
  if (bVar4 == 0) {
    pcVar5 = " (none)";
    lVar3 = 7;
  }
  else {
    if ((bVar4 & 8) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," subface",8);
      bVar4 = f->flags;
    }
    if ((bVar4 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," constant",9);
      bVar4 = f->flags;
    }
    if ((bVar4 & 4) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," nbconstant",0xb);
      bVar4 = f->flags;
    }
    if ((bVar4 & 2) == 0) goto LAB_0010a924;
    pcVar5 = " hasedits";
    lVar3 = 9;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar3);
LAB_0010a924:
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void DumpFaceInfo(const Ptex::FaceInfo& f)
{
    Ptex::Res res = f.res;
    std::cout << "  res: " << int(res.ulog2) << ' ' << int(res.vlog2)
              << " (" << res.u() << " x " << res.v() << ")"
              << "  adjface: " 
              << f.adjfaces[0] << ' '
              << f.adjfaces[1] << ' '
              << f.adjfaces[2] << ' '
              << f.adjfaces[3]
              << "  adjedge: " 
              << f.adjedge(0) << ' '
              << f.adjedge(1) << ' '
              << f.adjedge(2) << ' '
              << f.adjedge(3)
              << "  flags:";
    // output flag names
    if (f.flags == 0) std::cout << " (none)";
    else {
        if (f.isSubface()) std::cout << " subface";
        if (f.isConstant()) std::cout << " constant";
        if (f.isNeighborhoodConstant()) std::cout << " nbconstant";
        if (f.hasEdits()) std::cout << " hasedits";
    }
    std::cout << std::endl;
}